

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
CreateBCGeoEl(TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
              *this,int side,int bc)

{
  long size;
  int i;
  int iVar1;
  MElementType MVar2;
  ostream *poVar3;
  long lVar4;
  TPZGeoEl *pTVar5;
  int local_11c;
  initializer_list<int> local_118;
  TPZStack<int,_10> LowAllSides;
  TPZManVector<int,_27> mapside;
  
  if ((uint)side < 7) {
    local_11c = side + -3;
    iVar1 = pztopology::TPZTriangle::GetSideOrient(&local_11c);
    MVar2 = pztopology::TPZTriangle::Type(side);
    pztopology::TPZTriangle::NSideNodes(side);
    if (EQuadrilateral < MVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
                 ,0x124);
    }
    size = *(long *)(&DAT_01302ab8 + (ulong)MVar2 * 8);
    LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec =
         (_func_int **)
         ((ulong)LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec._4_4_ <<
         0x20);
    TPZManVector<int,_27>::TPZManVector(&mapside,size,(int *)&LowAllSides);
    for (lVar4 = 0; size != lVar4; lVar4 = lVar4 + 1) {
      mapside.super_TPZVec<int>.fStore[lVar4] = (int)lVar4;
    }
    if (iVar1 == -1) {
      if (MVar2 == EQuadrilateral) {
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements._0_4_ = 7;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements._4_4_ = 6;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNAlloc._0_4_ = 5;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNAlloc._4_4_ = 4;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec =
             (_func_int **)0x300000000;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore._0_4_ = 2;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore._4_4_ = 1;
        LowAllSides.super_TPZManVector<int,_10>.fExtAlloc[0] = 8;
        local_118._M_len = 9;
        local_118._M_array = (iterator)&LowAllSides;
        TPZManVector<int,_27>::operator=(&mapside,&local_118);
      }
      else if (MVar2 == ETriangle) {
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements._0_4_ = 4;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements._4_4_ = 3;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNAlloc._0_4_ = 6;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec =
             (_func_int **)0x200000000;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore._0_4_ = 1;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore._4_4_ = 5;
        local_118._M_len = 7;
        local_118._M_array = (iterator)&LowAllSides;
        TPZManVector<int,_27>::operator=(&mapside,&local_118);
      }
      else if (MVar2 == EOned) {
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec =
             (_func_int **)&local_118;
        local_118._M_array = (iterator)0x1;
        local_118._M_len = CONCAT44(local_118._M_len._4_4_,2);
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore._0_4_ = 3;
        LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore._4_4_ = 0;
        TPZManVector<int,_27>::operator=(&mapside,(initializer_list<int> *)&LowAllSides);
      }
    }
    TPZStack<int,_10>::TPZStack(&LowAllSides);
    pztopology::TPZTriangle::LowerDimensionSides(side,&LowAllSides);
    TPZStack<int,_10>::Push(&LowAllSides,side);
    pTVar5 = (TPZGeoEl *)
             (**(code **)(*(long *)&this->super_TPZGeoEl + 0x2e0))(this,side,bc,&mapside);
    TPZManVector<int,_10>::~TPZManVector(&LowAllSides.super_TPZManVector<int,_10>);
    TPZManVector<int,_27>::~TPZManVector(&mapside);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,")::CreateBCGeoEl unexpected side = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,side);
    std::operator<<(poVar3,"\n");
    pTVar5 = (TPZGeoEl *)0x0;
  }
  return pTVar5;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}